

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O2

int LS_Sector_SetGravity
              (line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  int iVar1;
  uint uVar2;
  FSectorTagIterator itr;
  
  iVar1 = 99;
  if (arg2 < 99) {
    iVar1 = arg2;
  }
  if (arg0 == 0) {
    itr.start = 0;
  }
  else {
    itr.start = tagManager.TagHashFirst[(ulong)(uint)arg0 & 0xff];
  }
  itr.searchtag = arg0;
  while( true ) {
    uVar2 = FSectorTagIterator::Next(&itr);
    if ((int)uVar2 < 0) break;
    sectors[uVar2].gravity = (double)iVar1 * 0.01 + (double)arg1;
  }
  return 1;
}

Assistant:

FUNC(LS_Sector_SetGravity)
// Sector_SetGravity (tag, intpart, fracpart)
{
	double gravity;

	if (arg2 > 99)
		arg2 = 99;
	gravity = (double)arg1 + (double)arg2 * 0.01;

	FSectorTagIterator itr(arg0);
	int secnum;
	while ((secnum = itr.Next()) >= 0)
		sectors[secnum].gravity = gravity;

	return true;
}